

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Collision *collision)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"crash: ",7);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(os,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," O: ",4);
  poVar1 = operator<<(poVar1,&collision->P);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," N: ",4);
  poVar1 = operator<<(poVar1,&collision->N);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," dist: ",7);
  poVar1 = std::ostream::_M_insert<double>(collision->dist);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," primitive: ",0xc);
  std::ostream::_M_insert<void_const*>(poVar1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Collision &collision) {
    os << "crash: " << collision.crash << " O: " << collision.P << " N: " << collision.N << " dist: " << collision.dist
       << " primitive: " << collision.primitive;
    return os;
}